

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O2

void __thiscall
Rml::ElementInstancerElement::~ElementInstancerElement(ElementInstancerElement *this)

{
  ElementInstancerPools *pEVar1;
  Iterator it;
  String local_48;
  
  (this->super_ElementInstancer)._vptr_ElementInstancer =
       (_func_int **)&PTR__ElementInstancerElement_00397ad8;
  pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  if (0 < (pEVar1->pool_element).num_allocated_objects) {
    Log::Message(LT_WARNING,"--- Found %d leaked element(s) ---");
    pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                       ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                        element_instancer_pools);
    it.node = (pEVar1->pool_element).first_allocated_node;
    while (it.node != (PoolNode *)0x0) {
      Element::GetAddress_abi_cxx11_(&local_48,(Element *)it.node,false,true);
      Log::Message(LT_WARNING,"    %s",local_48._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_48);
      Pool<Rml::Element>::Iterator::operator++(&it);
    }
    Log::Message(LT_WARNING,"------");
  }
  return;
}

Assistant:

ElementInstancerElement::~ElementInstancerElement()
{
	int num_elements = element_instancer_pools->pool_element.GetNumAllocatedObjects();
	if (num_elements > 0)
	{
		Log::Message(Log::LT_WARNING, "--- Found %d leaked element(s) ---", num_elements);

		for (auto it = element_instancer_pools->pool_element.Begin(); it; ++it)
			Log::Message(Log::LT_WARNING, "    %s", it->GetAddress().c_str());

		Log::Message(Log::LT_WARNING, "------");
	}
}